

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int dom_trans_func(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  MIR_context_t pMVar1;
  byte bVar2;
  MIR_item_t pMVar3;
  gen_ctx_t pgVar4;
  gen_ctx_t pgVar5;
  bitmap_el_t *pbVar6;
  int iVar7;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 extraout_RAX;
  MIR_context_t pMVar8;
  gen_ctx_t pgVar9;
  char *pcVar10;
  ulong *extraout_RDX;
  ulong *extraout_RDX_00;
  char *pcVar11;
  gen_ctx_t unaff_RBX;
  gen_ctx_t bm;
  MIR_context_t unaff_RBP;
  gen_ctx_t pgVar12;
  bb_t_conflict nb;
  bb_t_conflict nb_00;
  char *pcVar13;
  gen_ctx_t pgVar14;
  gen_ctx_t pgVar15;
  bitmap_el_t bVar16;
  MIR_context_t pMVar17;
  ulong uVar18;
  bitmap_t pVVar19;
  ulong *puVar20;
  MIR_context_t unaff_R12;
  MIR_context_t unaff_R13;
  ulong *unaff_R14;
  bb_t_conflict pbVar21;
  undefined8 uVar22;
  gen_ctx_t pgVar23;
  ulong *puVar24;
  
  pbVar21 = (bb_t_conflict)gen_ctx->temp_bitmap;
  if ((pbVar21 != (bb_t_conflict)0x0) && ((bitmap_el_t *)pbVar21->rpost != (bitmap_el_t *)0x0)) {
    pbVar21->index = 0;
    uVar18 = bb->index;
    bitmap_expand((bitmap_t)pbVar21,uVar18 + 1);
    ((bitmap_el_t *)pbVar21->rpost)[uVar18 >> 6] =
         ((bitmap_el_t *)pbVar21->rpost)[uVar18 >> 6] | 1L << (uVar18 & 0x3f);
    iVar7 = bitmap_ior(bb->dom_out,bb->dom_in,gen_ctx->temp_bitmap);
    return iVar7;
  }
  dom_trans_func_cold_1();
  if (bb == (bb_t_conflict)0x0) {
    bitmap_ior_cold_4();
    nb = bb;
    bm = gen_ctx;
LAB_00166050:
    bitmap_ior_cold_3();
LAB_00166055:
    bitmap_ior_cold_2();
    gen_ctx = unaff_RBX;
    bb = pbVar21;
  }
  else {
    nb = bb;
    bm = gen_ctx;
    unaff_R14 = extraout_RDX;
    if (extraout_RDX == (ulong *)0x0) goto LAB_00166050;
    unaff_R13 = (MIR_context_t)*extraout_RDX;
    unaff_R12 = (MIR_context_t)bb->index;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    nb = (bb_t_conflict)((long)unaff_RBP << 6);
    bitmap_expand((bitmap_t)gen_ctx,(size_t)nb);
    unaff_RBX = gen_ctx;
    pbVar21 = bb;
    if (gen_ctx == (gen_ctx_t)0x0) goto LAB_00166055;
    pMVar3 = gen_ctx->curr_func_item;
    if (unaff_RBP == (MIR_context_t)0x0) {
      if (pMVar3 != (MIR_item_t)0x0) {
        pMVar8 = (MIR_context_t)0x0;
        iVar7 = 0;
        goto LAB_00166039;
      }
    }
    else {
      nb = (bb_t_conflict)bb->rpost;
      bm = (gen_ctx_t)extraout_RDX[2];
      iVar7 = 0;
      pMVar8 = (MIR_context_t)0x0;
      pMVar17 = (MIR_context_t)0x0;
      do {
        if (pMVar17 < unaff_R12) {
          bVar16 = (&nb->index)[(long)pMVar17];
        }
        else {
          bVar16 = 0;
        }
        if (pMVar17 < unaff_R13) {
          pVVar19 = bm->call_used_hard_regs[(long)((long)&pMVar17[-1].setjmp_addr + 3)];
        }
        else {
          pVVar19 = (bitmap_t)0x0;
        }
        unaff_R14 = (ulong *)(&pMVar3->data)[(long)pMVar17];
        puVar20 = (ulong *)((ulong)pVVar19 | bVar16);
        pMVar1 = (MIR_context_t)((long)&pMVar17->gen_ctx + 1);
        if (puVar20 != (ulong *)0x0) {
          pMVar8 = pMVar1;
        }
        (&pMVar3->data)[(long)pMVar17] = puVar20;
        if (unaff_R14 != puVar20) {
          iVar7 = 1;
        }
        pMVar17 = pMVar1;
      } while (unaff_RBP != pMVar1);
      if (pMVar8 <= gen_ctx->ctx) {
LAB_00166039:
        gen_ctx->ctx = pMVar8;
        return iVar7;
      }
    }
  }
  bitmap_ior_cold_1();
  uVar22 = extraout_RAX;
  pgVar23 = gen_ctx;
  pbVar21 = bb;
  if (nb == (bb_t_conflict)0x0) {
    puVar24 = unaff_R14;
    bitmap_and_compl_cold_4();
    nb_00 = nb;
    pgVar15 = bm;
    puVar20 = unaff_R14;
    unaff_R14 = puVar24;
LAB_00166118:
    bitmap_and_compl_cold_3();
  }
  else {
    nb_00 = nb;
    pgVar15 = bm;
    puVar20 = extraout_RDX_00;
    if (extraout_RDX_00 == (ulong *)0x0) goto LAB_00166118;
    pgVar4 = (gen_ctx_t)*extraout_RDX_00;
    pgVar5 = (gen_ctx_t)nb->index;
    pgVar12 = pgVar4;
    if (pgVar4 < pgVar5) {
      pgVar12 = pgVar5;
    }
    nb_00 = (bb_t_conflict)((long)pgVar12 << 6);
    bitmap_expand((bitmap_t)bm,(size_t)nb_00);
    gen_ctx = bm;
    puVar20 = extraout_RDX_00;
    bb = nb;
    if (bm != (gen_ctx_t)0x0) {
      pMVar3 = bm->curr_func_item;
      if (pgVar12 == (gen_ctx_t)0x0) {
        if (pMVar3 != (MIR_item_t)0x0) {
          pgVar9 = (gen_ctx_t)0x0;
          goto LAB_00166101;
        }
      }
      else {
        pbVar6 = (bitmap_el_t *)nb->rpost;
        nb_00 = (bb_t_conflict)extraout_RDX_00[2];
        pgVar9 = (gen_ctx_t)0x0;
        pgVar14 = (gen_ctx_t)0x0;
        do {
          if (pgVar14 < pgVar5) {
            bVar16 = pbVar6[(long)pgVar14];
          }
          else {
            bVar16 = 0;
          }
          uVar18 = 0xffffffffffffffff;
          if (pgVar14 < pgVar4) {
            uVar18 = ~(&nb_00->index)[(long)pgVar14];
          }
          pgVar15 = (gen_ctx_t)((long)&pgVar14->ctx + 1);
          if ((void *)(uVar18 & bVar16) != (void *)0x0) {
            pgVar9 = pgVar15;
          }
          (&pMVar3->data)[(long)pgVar14] = (void *)(uVar18 & bVar16);
          pgVar14 = pgVar15;
        } while (pgVar12 != pgVar15);
        if (pgVar9 <= (gen_ctx_t)bm->ctx) {
LAB_00166101:
          bm->ctx = (MIR_context_t)pgVar9;
          return (int)pMVar3;
        }
      }
      goto LAB_00166122;
    }
  }
  bitmap_and_compl_cold_2();
  bm = gen_ctx;
  nb = bb;
LAB_00166122:
  bitmap_and_compl_cold_1();
  if (((FILE *)pgVar15->debug_file != (FILE *)0x0) && (1 < pgVar15->debug_level)) {
    bVar2 = *(byte *)((long)&nb_00->pre + 1);
    pcVar13 = "may/must alloca ";
    pMVar8 = pgVar15->ctx;
    if ((bVar2 & 3) == 0) {
      pcVar13 = "must alloca";
    }
    pcVar10 = "const val";
    pcVar11 = "";
    if (bVar2 != 0) {
      pcVar11 = pcVar13;
    }
    if ((char)nb_00->pre == '\0') {
      pcVar10 = "val";
    }
    fprintf((FILE *)pgVar15->debug_file,"%s%s=%lld for insn %lu:",pcVar11,pcVar10,nb_00->bfs,
            (ulong)*(uint *)((long)&nb_00->pre + 4),bm,puVar20,nb,uVar22,pgVar23,unaff_R12,unaff_R13
            ,unaff_R14,pbVar21,unaff_RBP);
    MIR_output_insn(pMVar8,pgVar15->debug_file,(MIR_insn_t_conflict)nb_00->index,
                    (pgVar15->curr_func_item->u).func,1);
    return extraout_EAX_00;
  }
  return extraout_EAX;
}

Assistant:

static int dom_trans_func (gen_ctx_t gen_ctx, bb_t bb) {
  bitmap_clear (temp_bitmap);
  bitmap_set_bit_p (temp_bitmap, bb->index);
  return bitmap_ior (bb->dom_out, bb->dom_in, temp_bitmap);
}